

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void evaluate_merging_condition(void)

{
  bool bVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  int i_1;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar12 [16];
  int pmerging_flag;
  int N_qp_g;
  int N_qp_p;
  int N_qp_e;
  double local_38;
  vector<int,_std::allocator<int>_> N_qp_i;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&N_qp_i,(long)n_ion_populations,(allocator_type *)&pmerging_flag);
  pmerging_flag = 0;
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 200,&N_qp_e,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xcc,&N_qp_p,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd0,&N_qp_g,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce(*(undefined8 *)
              ((long)psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd8),
             N_qp_i.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,n_ion_populations,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    pmerging_now = false;
    local_38 = (crpc * xlength * ylength * zlength) / (dx * dy * dz);
    bVar3 = std::operator==(&pmerging_abi_cxx11_,"ti");
    if (bVar3) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_38;
      iVar4 = N_qp_p + N_qp_e + N_qp_g;
      for (uVar6 = 0; (uint)(~(n_ion_populations >> 0x1f) & n_ion_populations) != uVar6;
          uVar6 = uVar6 + 1) {
        iVar4 = iVar4 + N_qp_i.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
      }
      auVar10._0_8_ = (double)iVar4;
      auVar10._8_8_ = in_XMM2_Qa;
      auVar11._0_8_ = (double)(n_ion_populations + 3);
      auVar11._8_8_ = in_XMM2_Qa;
      if (local_38 * auVar11._0_8_ < auVar10._0_8_) {
        auVar12 = vfnmadd213sd_fma(auVar12,auVar11,auVar10);
        pmerging_now = true;
        *ppd = auVar12._0_8_ / auVar10._0_8_;
        poVar5 = std::operator<<((ostream *)&std::cout,"\t\x1b[36m");
        std::operator<<(poVar5,"ppd = ");
        poVar5 = std::ostream::_M_insert<double>(*ppd);
        std::operator<<(poVar5,(string *)&TERM_NO_COLOR_abi_cxx11_);
      }
    }
    else {
      bVar3 = std::operator==(&pmerging_abi_cxx11_,"nl");
      pdVar2 = ppd;
      if (bVar3) {
        dVar9 = (double)N_qp_e;
        bVar3 = true;
        if (dVar9 <= local_38) {
          if ((double)N_qp_p <= local_38) {
            bVar3 = local_38 < (double)N_qp_g;
          }
        }
        uVar6 = (ulong)(uint)(~(n_ion_populations >> 0x1f) & n_ion_populations);
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          bVar1 = !bVar3;
          bVar3 = true;
          if (bVar1) {
            bVar3 = local_38 <
                    (double)N_qp_i.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
          }
        }
        if (bVar3) {
          pmerging_now = true;
          iVar4 = -3;
          if (-3 < n_ion_populations) {
            iVar4 = n_ion_populations;
          }
          for (uVar7 = 0; iVar4 + 3 != uVar7; uVar7 = uVar7 + 1) {
            pdVar2[uVar7] = 0.0;
          }
          if (local_38 < dVar9) {
            *ppd = (dVar9 - local_38) / dVar9;
          }
          pdVar2 = ppd;
          dVar9 = (double)N_qp_p;
          if (local_38 < dVar9) {
            ppd[1] = (dVar9 - local_38) / dVar9;
          }
          dVar9 = (double)N_qp_g;
          if (local_38 < dVar9) {
            pdVar2[2] = (dVar9 - local_38) / dVar9;
          }
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            dVar9 = (double)N_qp_i.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
            if (local_38 < dVar9) {
              pdVar2[uVar7 + 3] = (dVar9 - local_38) / dVar9;
            }
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"\t\x1b[36m");
          std::operator<<(poVar5,"ppd =");
          for (lVar8 = 0; lVar8 < (long)n_ion_populations + 3; lVar8 = lVar8 + 1) {
            std::operator<<((ostream *)&std::cout,' ');
            std::ostream::_M_insert<double>(ppd[lVar8]);
          }
          std::operator<<((ostream *)&std::cout,(string *)&TERM_NO_COLOR_abi_cxx11_);
        }
      }
    }
    pmerging_flag = (int)pmerging_now;
  }
  MPI_Bcast(&pmerging_flag,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
  MPI_Bcast(ppd,n_ion_populations + 3,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  pmerging_now = pmerging_flag == 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&N_qp_i.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void evaluate_merging_condition()
{
    int N_qp_e, N_qp_p, N_qp_g;
    auto N_qp_i = vector<int>(n_ion_populations);
    int pmerging_flag = 0; // bools are not supported by MPI

    MPI_Reduce(&(psr->N_qp_e), &N_qp_e, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_p), &N_qp_p, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_g), &N_qp_g, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->N_qp_i, &(N_qp_i[0]), n_ion_populations, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

    if (mpi_rank == 0) {
        double crnp = crpc*xlength*ylength*zlength/(dx*dy*dz);
        pmerging_now = false;
        if (pmerging=="ti") {
            int N_qp;
            N_qp = N_qp_e + N_qp_p + N_qp_g;
            for (int i = 0; i < n_ion_populations; i++)
                N_qp += N_qp_i[i];
            if (N_qp>(3+n_ion_populations)*crnp) {
                pmerging_now = true;
                // portion of particles that will be deleted
                ppd[0] = (N_qp - (3+n_ion_populations)*crnp)/N_qp;
                cout<<"\t\033[36m"<<"ppd = "<<ppd[0]<<TERM_NO_COLOR;
            }
        } else if (pmerging=="nl") {
            bool merge = (N_qp_e>crnp)||(N_qp_p>crnp)||(N_qp_g>crnp);
            for (int i = 0; i < n_ion_populations; ++i)
                merge = merge || (N_qp_i[i]>crnp);
            if (merge) {
                pmerging_now = true;
                // portion of particles that will be deleted
                for (int i=0;i<3+n_ion_populations;i++)
                    ppd[i] = 0;
                if (N_qp_e>crnp)
                    ppd[0] = (N_qp_e - crnp)/N_qp_e;
                if (N_qp_p>crnp)
                    ppd[1] = (N_qp_p - crnp)/N_qp_p;
                if (N_qp_g>crnp)
                    ppd[2] = (N_qp_g - crnp)/N_qp_g;
                for (int i=0;i<n_ion_populations;i++) {
                    if (N_qp_i[i]>crnp)
                        ppd[3+i] = (N_qp_i[i] - crnp)/N_qp_i[i];
                }
                cout<<"\t\033[36m"<<"ppd =";
                for (int i=0;i<3+n_ion_populations;i++) {
                    cout<<' '<<ppd[i];
                }
                cout<<TERM_NO_COLOR;
            }
        }
        pmerging_flag = pmerging_now;
    }
    MPI_Bcast(&pmerging_flag, 1, MPI_INT, 0, MPI_COMM_WORLD);
    MPI_Bcast(ppd, 3+n_ion_populations, MPI_DOUBLE, 0, MPI_COMM_WORLD);

    pmerging_now = (pmerging_flag == 1);
}